

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

uint8_t * flatbuffers::AddFlatBuffer
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *flatbuf,uint8_t *newbuf,
                    size_t newlen)

{
  uint8_t *this;
  uint uVar1;
  size_type_conflict sVar2;
  uchar *puVar3;
  bool bVar4;
  unsigned_long root_offset;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_38;
  const_iterator local_30;
  uint local_28;
  value_type_conflict1 local_21;
  uoffset_t insertion_point;
  size_t newlen_local;
  uint8_t *newbuf_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *flatbuf_local;
  
  _insertion_point = newlen;
  newlen_local = (size_t)newbuf;
  newbuf_local = (uint8_t *)flatbuf;
  while( true ) {
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)newbuf_local);
    bVar4 = true;
    if ((sVar2 & 3) == 0) {
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)newbuf_local);
      bVar4 = (sVar2 & 7) == 0;
    }
    if (!bVar4) break;
    local_21 = '\0';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)newbuf_local,&local_21);
  }
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)newbuf_local);
  this = newbuf_local;
  local_28 = (uint)sVar2;
  local_38._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)newbuf_local);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_30,&local_38);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,local_30,
             (uchar *)(newlen_local + 4),(uchar *)(newlen_local + _insertion_point));
  uVar1 = ReadScalar<unsigned_int>((void *)newlen_local);
  puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)newbuf_local);
  return puVar3 + ((ulong)uVar1 - 4) + (ulong)local_28;
}

Assistant:

const uint8_t *AddFlatBuffer(std::vector<uint8_t> &flatbuf,
                             const uint8_t *newbuf, size_t newlen) {
  // Align to sizeof(uoffset_t) past sizeof(largest_scalar_t) since we're
  // going to chop off the root offset.
  while ((flatbuf.size() & (sizeof(uoffset_t) - 1)) ||
         !(flatbuf.size() & (sizeof(largest_scalar_t) - 1))) {
    flatbuf.push_back(0);
  }
  auto insertion_point = static_cast<uoffset_t>(flatbuf.size());
  // Insert the entire FlatBuffer minus the root pointer.
  flatbuf.insert(flatbuf.end(), newbuf + sizeof(uoffset_t), newbuf + newlen);
  auto root_offset = ReadScalar<uoffset_t>(newbuf) - sizeof(uoffset_t);
  return flatbuf.data() + insertion_point + root_offset;
}